

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylstrmatrix.cpp
# Opt level: O0

TPZMatrix<std::complex<double>_> * __thiscall
TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Create
          (TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this)

{
  int64_t iVar1;
  TPZVec<long> *this_00;
  long *in_RDI;
  int64_t neq;
  TPZVec<long> skyline;
  TPZEquationFilter *in_stack_ffffffffffffff98;
  TPZVec<long> *in_stack_ffffffffffffffd8;
  TPZEquationFilter *in_stack_ffffffffffffffe0;
  
  TPZVec<long>::TPZVec((TPZVec<long> *)&stack0xffffffffffffffd8);
  (**(code **)(*(long *)in_RDI[1] + 0xe8))
            ((long *)in_RDI[1],(TPZVec<long> *)&stack0xffffffffffffffd8);
  TPZEquationFilter::FilterSkyline(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar1 = TPZEquationFilter::NActiveEquations(in_stack_ffffffffffffff98);
  this_00 = (TPZVec<long> *)(**(code **)(*in_RDI + 0x58))(in_RDI,iVar1,&stack0xffffffffffffffd8);
  TPZVec<long>::~TPZVec(this_00);
  return (TPZMatrix<std::complex<double>_> *)this_00;
}

Assistant:

TPZMatrix<TVar> * TPZSkylineStructMatrix<TVar,TPar>::Create(){
    TPZVec<int64_t> skyline;
    this->fMesh->Skyline(skyline);
    this->fEquationFilter.FilterSkyline(skyline);
    int64_t neq = this->fEquationFilter.NActiveEquations();
//    std::cout << skyline << std::endl;
    return this->ReallyCreate(neq,skyline);//new TPZSkylMatrix<TVar>(neq,skyline);
}